

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_Same_Test::~iu_SyntaxTest_x_iutest_x_Same_Test
          (iu_SyntaxTest_x_iutest_x_Same_Test *this)

{
  iu_SyntaxTest_x_iutest_x_Same_Test *this_local;
  
  ~iu_SyntaxTest_x_iutest_x_Same_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(SyntaxTest, Same)
{
    int v = 0;
    if( int* p = &v )
        IUTEST_ASSERT_SAME(v, *p) << p;
    if( int* p = &v )
        IUTEST_EXPECT_SAME(v, *p) << p;
    if( int* p = &v )
        IUTEST_INFORM_SAME(v, *p) << p;
    if( int* p = &v )
        IUTEST_ASSUME_SAME(v, *p) << p;
}